

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwaitcondition_unix.cpp
# Opt level: O2

void __thiscall QWaitCondition::QWaitCondition(QWaitCondition *this)

{
  QWaitConditionPrivate *pQVar1;
  int iVar2;
  pthread_mutex_t *__mutex;
  long in_FS_OFFSET;
  pthread_condattr_t condattr;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_thread_qwaitcondition_unix_cpp:38:32)>
  local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  __mutex = (pthread_mutex_t *)operator_new(0x60);
  this->d = (QWaitConditionPrivate *)__mutex;
  iVar2 = pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  qt_report_pthread_error(iVar2,"QWaitCondition","mutex init");
  pQVar1 = this->d;
  condattr.__align = -0x55555556;
  pthread_condattr_init((pthread_condattr_t *)&condattr);
  local_38.m_invoke = true;
  local_38._9_7_ = 0xaaaaaaaaaaaaaa;
  local_38.m_func.condattr = &condattr;
  pthread_condattr_setclock((pthread_condattr_t *)&condattr,1);
  iVar2 = pthread_cond_init((pthread_cond_t *)&pQVar1->cond,(pthread_condattr_t *)&condattr);
  qt_report_pthread_error(iVar2,"QWaitCondition","cv init");
  QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/thread/qwaitcondition_unix.cpp:38:32)>
  ::~QScopeGuard(&local_38);
  pQVar1 = this->d;
  pQVar1->waiters = 0;
  pQVar1->wakeups = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QWaitCondition::QWaitCondition()
{
    d = new QWaitConditionPrivate;
    qt_report_pthread_error(pthread_mutex_init(&d->mutex, nullptr), "QWaitCondition", "mutex init");
    qt_initialize_pthread_cond(&d->cond, "QWaitCondition");
    d->waiters = d->wakeups = 0;
}